

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void train_node(log_multi *b,single_learner *base,example *ec,uint32_t *current,
               uint32_t *class_index,uint32_t param_6)

{
  float *pfVar1;
  uint32_t *puVar2;
  float fVar3;
  uint uVar4;
  node *pnVar5;
  node_pred *pnVar6;
  
  pnVar5 = (b->nodes)._begin;
  fVar3 = pnVar5[*current].norm_Eh;
  pfVar1 = &pnVar5[*current].preds._begin[*class_index].norm_Ehk;
  (ec->l).simple.label =
       *(float *)(&DAT_0023ee54 + (ulong)(*pfVar1 <= fVar3 && fVar3 != *pfVar1) * 4);
  LEARNER::learner<char,_example>::learn(base,ec,(ulong)(b->nodes)._begin[*current].base_predictor);
  (ec->l).multi.label = 0x7f7fffff;
  LEARNER::learner<char,_example>::predict
            (base,ec,(ulong)(b->nodes)._begin[*current].base_predictor);
  pnVar5 = (b->nodes)._begin;
  pnVar5[*current].Eh = (double)ec->partial_prediction + pnVar5[*current].Eh;
  pnVar6 = (b->nodes)._begin[*current].preds._begin;
  pnVar6[*class_index].Ehk = (double)ec->partial_prediction + pnVar6[*class_index].Ehk;
  puVar2 = &(b->nodes)._begin[*current].n;
  *puVar2 = *puVar2 + 1;
  puVar2 = &(b->nodes)._begin[*current].preds._begin[*class_index].nk;
  *puVar2 = *puVar2 + 1;
  uVar4 = *current;
  pnVar5 = (b->nodes)._begin;
  pnVar5[uVar4].norm_Eh = (float)pnVar5[uVar4].Eh / (float)pnVar5[uVar4].n;
  uVar4 = *class_index;
  pnVar6 = (b->nodes)._begin[*current].preds._begin;
  pnVar6[uVar4].norm_Ehk = (float)pnVar6[uVar4].Ehk / (float)pnVar6[uVar4].nk;
  return;
}

Assistant:

void train_node(
    log_multi& b, single_learner& base, example& ec, uint32_t& current, uint32_t& class_index, uint32_t /* depth */)
{
  if (b.nodes[current].norm_Eh > b.nodes[current].preds[class_index].norm_Ehk)
    ec.l.simple.label = -1.f;
  else
    ec.l.simple.label = 1.f;

  base.learn(ec, b.nodes[current].base_predictor);  // depth

  ec.l.simple.label = FLT_MAX;
  base.predict(ec, b.nodes[current].base_predictor);  // depth

  b.nodes[current].Eh += (double)ec.partial_prediction;
  b.nodes[current].preds[class_index].Ehk += (double)ec.partial_prediction;
  b.nodes[current].n++;
  b.nodes[current].preds[class_index].nk++;

  b.nodes[current].norm_Eh = (float)b.nodes[current].Eh / b.nodes[current].n;
  b.nodes[current].preds[class_index].norm_Ehk =
      (float)b.nodes[current].preds[class_index].Ehk / b.nodes[current].preds[class_index].nk;
}